

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O0

void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Vec_Ptr_t *vFrontier_00;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar3;
  int local_38;
  int fUseMuxes;
  int k;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pNode;
  Vec_Ptr_t *vFrontier;
  Aig_Obj_t *pObj_local;
  Ssw_Sat_t *p_local;
  
  iVar2 = Ssw_ObjSatNum(p,pObj);
  if (iVar2 == 0) {
    vFrontier_00 = Vec_PtrAlloc(100);
    Ssw_ObjAddToFrontier(p,pObj,vFrontier_00);
    for (fUseMuxes = 0; iVar2 = Vec_PtrSize(vFrontier_00), fUseMuxes < iVar2;
        fUseMuxes = fUseMuxes + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vFrontier_00,fUseMuxes);
      iVar2 = Ssw_ObjSatNum(p,pObj_00);
      if (iVar2 == 0) {
        __assert_fail("Ssw_ObjSatNum(p,pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                      ,0x16e,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
      }
      iVar2 = Aig_ObjIsMuxType(pObj_00);
      if (iVar2 == 0) {
        Ssw_CollectSuper(pObj_00,1,p->vFanins);
        for (local_38 = 0; iVar2 = Vec_PtrSize(p->vFanins), local_38 < iVar2;
            local_38 = local_38 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vFanins,local_38);
          pAVar3 = Aig_Regular(pAVar3);
          Ssw_ObjAddToFrontier(p,pAVar3,vFrontier_00);
        }
        Ssw_AddClausesSuper(p,pObj_00,p->vFanins);
      }
      else {
        Vec_PtrClear(p->vFanins);
        pVVar1 = p->vFanins;
        pAVar3 = Aig_ObjFanin0(pObj_00);
        pAVar3 = Aig_ObjFanin0(pAVar3);
        Vec_PtrPushUnique(pVVar1,pAVar3);
        pVVar1 = p->vFanins;
        pAVar3 = Aig_ObjFanin1(pObj_00);
        pAVar3 = Aig_ObjFanin0(pAVar3);
        Vec_PtrPushUnique(pVVar1,pAVar3);
        pVVar1 = p->vFanins;
        pAVar3 = Aig_ObjFanin0(pObj_00);
        pAVar3 = Aig_ObjFanin1(pAVar3);
        Vec_PtrPushUnique(pVVar1,pAVar3);
        pVVar1 = p->vFanins;
        pAVar3 = Aig_ObjFanin1(pObj_00);
        pAVar3 = Aig_ObjFanin1(pAVar3);
        Vec_PtrPushUnique(pVVar1,pAVar3);
        for (local_38 = 0; iVar2 = Vec_PtrSize(p->vFanins), local_38 < iVar2;
            local_38 = local_38 + 1) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vFanins,local_38);
          pAVar3 = Aig_Regular(pAVar3);
          Ssw_ObjAddToFrontier(p,pAVar3,vFrontier_00);
        }
        Ssw_AddClausesMux(p,pObj_00);
      }
      iVar2 = Vec_PtrSize(p->vFanins);
      if (iVar2 < 2) {
        __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                      ,0x181,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
      }
    }
    Vec_PtrFree(vFrontier_00);
  }
  return;
}

Assistant:

void Ssw_CnfNodeAddToSolver( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Ssw_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ssw_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesMux( p, pNode );
        }
        else
        {
            Ssw_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}